

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O1

void __thiscall Scs::Client::Run(Client *this)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  size_t __new_size;
  BufferPtr receivedData;
  BufferPtr receiveBuffer;
  AddressPtr address;
  ReceiveQueue receiveQueue;
  undefined1 local_148 [32];
  Address *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined1 local_118 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  __native_type local_f8;
  _Map_pointer local_d0;
  __native_type local_c8;
  size_t sStack_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  CreateAddress((Scs *)&local_128,&this->m_port,&this->m_address);
  CreateBuffer();
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_148._16_8_,0x20000);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  sStack_a0 = 0;
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  _Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                       *)&local_c8.__data,0);
  local_48 = 0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  lVar7 = std::chrono::_V2::system_clock::now();
  if ((this->m_status)._M_i != Shutdown) {
    local_f8.__data.__list.__prev = (__pthread_internal_list *)&this->m_onUpdate;
    local_f8.__data.__list.__next = (__pthread_internal_list *)&this->m_onReceiveData;
    local_f8._16_8_ = &this->m_onConnect;
    do {
      local_148._0_8_ = (element_type *)0x0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf4240;
      do {
        iVar6 = nanosleep((timespec *)local_148,(timespec *)local_148);
        if (iVar6 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      if ((this->m_status)._M_i == Initial) {
        local_f8.__align = (long)local_128;
        local_f8._8_8_ = local_120;
        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_120->_M_use_count = local_120->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_120->_M_use_count = local_120->_M_use_count + 1;
          }
        }
        CreateSocket((Scs *)local_148,(AddressPtr *)&local_f8.__data);
        uVar4 = local_148._8_8_;
        uVar3 = local_148._0_8_;
        local_148._0_8_ = (element_type *)0x0;
        local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar3;
        (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        }
        Socket::SetNonBlocking
                  ((this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,true);
        bVar5 = Socket::Connect((this->m_socket).
                                super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (!bVar5) {
          LogWriteLine("Error connecting client socket.");
          LOCK();
          (this->m_status)._M_i = Shutdown;
          UNLOCK();
          LOCK();
          (this->m_error)._M_base._M_i = true;
          UNLOCK();
          break;
        }
        LOCK();
        (this->m_status)._M_i = Connecting;
        UNLOCK();
        lVar7 = std::chrono::_V2::system_clock::now();
        local_148._0_8_ = (element_type *)0x0;
        local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5f5e100;
        do {
          iVar6 = nanosleep((timespec *)local_148,(timespec *)local_148);
          if (iVar6 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
      else if ((this->m_status)._M_i == Connecting) {
        lVar9 = std::chrono::_V2::system_clock::now();
        if (this->m_timeoutMs * 1000000 + lVar7 < lVar9) {
          bVar5 = Address::Next(local_128);
          if (bVar5) {
            LOCK();
            (this->m_status)._M_i = Initial;
            UNLOCK();
            lVar7 = std::chrono::_V2::system_clock::now();
            LogWriteLine("Client failed to connect - trying next address.");
          }
          else {
            LOCK();
            (this->m_status)._M_i = ConnectionTimeout;
            UNLOCK();
            LogWriteLine("Client failed to connect.");
          }
        }
        else {
          bVar5 = Socket::IsWritable((this->m_socket).
                                     super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
          if (bVar5) {
            LOCK();
            (this->m_status)._M_i = Ready;
            UNLOCK();
            LogWriteLine("Client established connection with server.");
            if ((this->m_onConnect).super__Function_base._M_manager != (_Manager_type)0x0) {
              (*(this->m_onConnect)._M_invoker)((_Any_data *)local_f8._16_8_,&this->super_IClient);
            }
          }
        }
      }
      else if ((this->m_status)._M_i == ConnectionTimeout) {
        LogWriteLine("Client retry not yet implemented.  Shutting down client.");
        LOCK();
        (this->m_error)._M_base._M_i = true;
        UNLOCK();
        LOCK();
        (this->m_status)._M_i = Shutdown;
        UNLOCK();
      }
      else if ((this->m_status)._M_i == Ready) {
        if ((this->m_onUpdate).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->m_onUpdate)._M_invoker)
                    ((_Any_data *)local_f8.__data.__list.__prev,&this->super_IClient);
        }
        bVar5 = Socket::IsWritable((this->m_socket).
                                   super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        if ((bVar5) && (bVar5 = SendQueue::Empty(&this->m_sendQueue), !bVar5)) {
          local_118._16_8_ =
               (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100)->_M_use_count + 1;
            }
          }
          bVar5 = SendQueue::Send(&this->m_sendQueue,(SocketPtr *)(local_118 + 0x10));
          if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
          }
          if (!bVar5) {
            LogWriteLine("Error sending data to server.  Shutting down connection.");
            LOCK();
            (this->m_status)._M_i = Shutdown;
            UNLOCK();
            break;
          }
          local_148._0_8_ = (element_type *)0x0;
          local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x989680;
          do {
            iVar6 = nanosleep((timespec *)local_148,(timespec *)local_148);
            if (iVar6 != -1) break;
            piVar8 = __errno_location();
          } while (*piVar8 == 4);
        }
        bVar5 = Socket::IsReadable((this->m_socket).
                                   super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        if (bVar5) {
          std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_148._16_8_,
                     *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                                local_148._16_8_)->_M_impl).field_0x10 -
                     *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                               local_148._16_8_)->_M_impl);
          pvVar1 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                              local_148._16_8_)->_M_impl;
          __new_size = Socket::Receive((this->m_socket).
                                       super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr,pvVar1,
                                       *(long *)&(((
                                                  _Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                                  *)local_148._16_8_)->_M_impl).field_0x10 -
                                       (long)pvVar1,0);
          if (__new_size != 0) {
            std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_148._16_8_,
                       __new_size);
            pvVar1 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                                local_148._16_8_)->_M_impl;
            ReceiveQueue::Push((ReceiveQueue *)&local_c8.__data,pvVar1,
                               *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                            *)local_148._16_8_)->_M_impl).field_0x8 - (long)pvVar1);
            lVar9 = *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                              local_148._16_8_)->_M_impl;
            if (*(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                           local_148._16_8_)->_M_impl).field_0x8 != lVar9) {
              *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                         local_148._16_8_)->_M_impl).field_0x8 = lVar9;
            }
            ReceiveQueue::Pop((ReceiveQueue *)local_148);
            while ((element_type *)local_148._0_8_ != (element_type *)0x0) {
              if ((this->m_onReceiveData).super__Function_base._M_manager != (_Manager_type)0x0) {
                local_118._0_8_ = *(undefined8 *)(int *)local_148._0_8_;
                local_d0 = (_Map_pointer)
                           ((long)(((AddressPtr *)(local_148._0_8_ + 8))->
                                  super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr - local_118._0_8_);
                (*(this->m_onReceiveData)._M_invoker)
                          ((_Any_data *)local_f8.__data.__list.__next,&this->super_IClient,
                           (void **)local_118,(unsigned_long *)&local_d0);
              }
              ReceiveQueue::Pop((ReceiveQueue *)local_118);
              uVar4 = local_118._8_8_;
              local_148._0_8_ = local_118._0_8_;
              uVar3 = local_148._8_8_;
              local_118._0_8_ = (element_type *)0x0;
              local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_148._8_8_ = uVar4;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
            }
          }
        }
      }
    } while ((this->m_status)._M_i != Shutdown);
  }
  if ((this->m_onDisconnect).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_onDisconnect)._M_invoker)((_Any_data *)&this->m_onDisconnect,&this->super_IClient);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  std::
  deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::~deque((deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
            *)&local_c8.__data);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  return;
}

Assistant:

void Client::Run()
{
	// Create address from port and address strings
	AddressPtr address = CreateAddress(m_port, m_address);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Create a receive queue
	ReceiveQueue receiveQueue;

	// Mark initial time
	auto statusTime = std::chrono::system_clock::now();

	// Loop until we get a shutdown request
	while (m_status != Status::Shutdown)
	{
		// We don't want to burn too much CPU while idling.
		std::this_thread::sleep_for(std::chrono::milliseconds(1));

		if (m_status == Status::Initial)
		{
			m_socket = CreateSocket(address);
			m_socket->SetNonBlocking(true);
			if (!m_socket->Connect())
			{
				LogWriteLine("Error connecting client socket.");
				m_status = Status::Shutdown;
				m_error = true;
				break;
			}
			m_status = Status::Connecting;
			statusTime = std::chrono::system_clock::now();

            // On macOS, without this slight delay after a connect attempt, the socket returns immediate
            // success on IsWriteable(), even if no connection is present.
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
		}
		else if (m_status == Status::Connecting)
		{
			if (std::chrono::system_clock::now() > statusTime + std::chrono::milliseconds(m_timeoutMs))
			{
				if (address->Next())
				{
					m_status = Status::Initial;
					statusTime = std::chrono::system_clock::now();
					LogWriteLine("Client failed to connect - trying next address.");
				}
				else
				{
					m_status = Status::ConnectionTimeout;
					LogWriteLine("Client failed to connect.");
				}
			}
			else
			{
				if (m_socket->IsWritable())
				{
                    m_status = Status::Ready;
                    LogWriteLine("Client established connection with server.");
					if (m_onConnect)
						m_onConnect(*this);
				}
			}
		}
		else if (m_status == Status::ConnectionTimeout)
		{
			// TODO: Wait some period and try again for a limited number of tries.  For now, we just fail
			LogWriteLine("Client retry not yet implemented.  Shutting down client.");
			m_error = true;
			m_status = Status::Shutdown;
		}
		else if (m_status == Status::Ready)
		{
			if (m_onUpdate)
				m_onUpdate(*this);

			// Check first to see if we can write to the socket
			if (m_socket->IsWritable())
			{
				if (!m_sendQueue.Empty())
				{
					if (!m_sendQueue.Send(m_socket))
					{
						LogWriteLine("Error sending data to server.  Shutting down connection.");
						m_status = Status::Shutdown;
						break;
					}

					// We need to throttle our connection transmission rate
					std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));
				}
			}

			// Check for incoming data
			if (m_socket->IsReadable())
			{
				// Read data from socket
				receiveBuffer->resize(receiveBuffer->capacity());
				size_t bytesReceived = m_socket->Receive(receiveBuffer->data(), receiveBuffer->capacity(), 0);
				if (bytesReceived)
				{
					// Push data into the receive queue
					receiveBuffer->resize(bytesReceived);
					receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
					receiveBuffer->clear();

					// Process data in receive queue
					BufferPtr receivedData = receiveQueue.Pop();
					while (receivedData)
					{
						if (m_onReceiveData)
							m_onReceiveData(*this, receivedData->data(), receivedData->size());
						receivedData = receiveQueue.Pop();
					}
				}
			}
		}
	}

	if (m_onDisconnect)
		m_onDisconnect(*this);
	m_socket = nullptr;
}